

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O2

void __thiscall
CTcSymFunc::gen_code_call
          (CTcSymFunc *this,int discard,int argc,int varargs,CTcNamedArgs *named_args)

{
  byte bVar1;
  int iVar2;
  size_t sVar3;
  int iVar4;
  char *pcVar5;
  CTcSymFunc *this_00;
  undefined4 in_register_0000000c;
  size_t __n;
  ulong *puVar6;
  void *__buf;
  void *__buf_00;
  void *extraout_RDX;
  void *__buf_01;
  void *extraout_RDX_00;
  uchar opc;
  ulong val;
  char *pcVar7;
  CTcGenTarg *pCVar8;
  char buf [128];
  
  __n = CONCAT44(in_register_0000000c,varargs);
  bVar1 = (this->super_CTcSymFuncBase).field_0x80;
  if (-1 < (char)bVar1) {
    CTcTokenizer::log_error
              (0x2d2e,(ulong)(uint)(this->super_CTcSymFuncBase).super_CTcSymbol.super_CTcSymbolBase.
                                   super_CVmHashEntryCS.super_CVmHashEntry.len_,
               (this->super_CTcSymFuncBase).super_CTcSymbol.super_CTcSymbolBase.super_CVmHashEntryCS
               .super_CVmHashEntry.str_);
    return;
  }
  if ((bVar1 & 0x20) == 0) {
    if (varargs != 0) {
      CTcGenTarg::write_op(G_cg,'v');
    }
    CTcGenTarg::write_op(G_cg,'X');
    CTcDataStream::write(&G_cs->super_CTcDataStream,(int)(char)argc,__buf,__n);
    if ((G_cg->field_0xd0 & 4) == 0) {
      CTcSymFuncBase::add_abs_fixup(&this->super_CTcSymFuncBase,&G_cs->super_CTcDataStream);
      val = 0;
    }
    else {
      puVar6 = &((this->super_CTcSymFuncBase).anchor_)->addr_;
      if ((this->field_0x90 & 1) != 0) {
        puVar6 = &this->abs_addr_;
      }
      val = *puVar6;
    }
    pCVar8 = (CTcGenTarg *)G_cs;
    CTcDataStream::write4(&G_cs->super_CTcDataStream,val);
    G_cg->sp_depth_ = G_cg->sp_depth_ - argc;
    CTcGenTarg::post_call_cleanup(pCVar8,named_args);
    iVar4 = CTcSymFuncBase::argc_ok(&this->super_CTcSymFuncBase,argc);
    if (iVar4 == 0) {
      sVar3 = (this->super_CTcSymFuncBase).super_CTcSymbol.super_CTcSymbolBase.super_CVmHashEntryCS.
              super_CVmHashEntry.len_;
      pcVar7 = (this->super_CTcSymFuncBase).super_CTcSymbol.super_CTcSymbolBase.super_CVmHashEntryCS
               .super_CVmHashEntry.str_;
      pcVar5 = CTcSymFuncBase::get_argc_desc(&this->super_CTcSymFuncBase,buf);
      CTcTokenizer::log_error(0x2d13,(ulong)(uint)sVar3,pcVar7,pcVar5,(ulong)(uint)argc);
    }
    if (discard != 0) {
      return;
    }
    CTcGenTarg::write_op(G_cg,0x8b);
    pCVar8 = G_cg;
    iVar2 = G_cg->sp_depth_;
    iVar4 = iVar2 + 1;
    G_cg->sp_depth_ = iVar4;
    if (iVar2 < pCVar8->max_sp_depth_) {
      return;
    }
    pCVar8->max_sp_depth_ = iVar4;
    return;
  }
  if (varargs == 0) {
    if (0xff < argc) {
      CTcGenTarg::write_op(G_cg,0xc1);
      CTcDataStream::write2(&G_cs->super_CTcDataStream,argc);
      __buf_01 = extraout_RDX_00;
      goto LAB_00241fb7;
    }
    opc = 0xc0;
  }
  else {
    opc = 'v';
  }
  CTcGenTarg::write_op(G_cg,opc);
  CTcDataStream::write(&G_cs->super_CTcDataStream,(int)(char)argc,__buf_00,__n);
  __buf_01 = extraout_RDX;
LAB_00241fb7:
  CTcDataStream::write(&G_cs->super_CTcDataStream,(int)(char)G_cg->predef_meta_idx_[1],__buf_01,__n)
  ;
  pCVar8 = G_cg;
  G_cg->sp_depth_ = G_cg->sp_depth_ - argc;
  CTcGenTarg::write_op(pCVar8,0x8b);
  pCVar8 = G_cg;
  iVar4 = G_cg->sp_depth_;
  G_cg->sp_depth_ = iVar4 + 1;
  if (pCVar8->max_sp_depth_ <= iVar4) {
    pCVar8->max_sp_depth_ = iVar4 + 1;
  }
  buf[8] = '\t';
  buf[9] = '\0';
  buf[10] = '\0';
  buf[0xb] = '\0';
  buf[0x28] = '\0';
  buf._0_8_ = &PTR_gen_code_003505b8;
  buf._16_8_ = this;
  CTPNConst::gen_code((CTPNConst *)buf,0,iVar4);
  pcVar7 = "_multiMethodCall";
  this_00 = (CTcSymFunc *)
            CTcPrsSymtab::find_delete_weak(G_prs->global_symtab_,"_multiMethodCall",0x10);
  if (this_00 == (CTcSymFunc *)0x0) {
    this_00 = (CTcSymFunc *)CTcSymbolBase::operator_new((CTcSymbolBase *)0x98,(size_t)pcVar7);
    CTcSymFunc(this_00,"_multiMethodCall",0x10,0,1,0,1,1,0,0,1,1);
    (*G_prs->global_symtab_->_vptr_CTcPrsSymtab[3])(G_prs->global_symtab_,this_00);
  }
  else if (*(int *)&((CVmHashEntry *)
                    &(this_00->super_CTcSymFuncBase).super_CTcSymbol.super_CTcSymbolBase)->
                    field_0x24 != 1) {
    CTcTokenizer::log_error(0x2b58,0x10,"_multiMethodCall");
    return;
  }
  (*((CVmHashEntry *)&(this_00->super_CTcSymFuncBase).super_CTcSymbol.super_CTcSymbolBase)->
    _vptr_CVmHashEntry[0x1b])(this_00,discard,2,0,named_args);
  return;
}

Assistant:

void CTcSymFunc::gen_code_call(int discard, int argc, int varargs,
                               CTcNamedArgs *named_args)
{
    /* we can't call a function that doesn't have a prototype */
    if (!has_proto_)
    {
        G_tok->log_error(TCERR_FUNC_CALL_NO_PROTO,
                         (int)get_sym_len(), get_sym());
        return;
    }

    /*
     *   If this is a multi-method base function, a call to the function is
     *   actually a call to _multiMethodCall('name', args).  
     */
    if (is_multimethod_base_)
    {
        /* make a list out of the arguments */
        if (varargs)
        {
            G_cg->write_op(OPC_VARARGC);
            G_cs->write((char)argc);
        }
        else if (argc <= 255)
        {
            G_cg->write_op(OPC_NEW1);
            G_cs->write((char)argc);
        }
        else
        {
            G_cg->write_op(OPC_NEW2);
            G_cs->write2(argc);
        }
        G_cs->write((char)G_cg->get_predef_meta_idx(TCT3_METAID_LIST));
        G_cg->note_pop(argc);

        G_cg->write_op(OPC_GETR0);
        G_cg->note_push();

        /* add the base function pointer argument */
        CTcConstVal funcval;
        funcval.set_funcptr(this);
        CTPNConst func(&funcval);
        func.gen_code(FALSE, FALSE);

        /* look up _multiMethodCall */
        CTcSymFunc *mmc = get_internal_func(
            "_multiMethodCall", 1, 0, TRUE, TRUE);

        /* 
         *   Generate the call.  Note that there are always two arguments at
         *   this point: the base function pointer, and the argument list.
         *   The argument list is just one argument because we've already
         *   constructed a list out of it.  
         */
        if (mmc != 0)
            mmc->gen_code_call(discard, 2, FALSE, named_args);
    }
    else
    {
        /* write the varargs modifier if appropriate */
        if (varargs)
            G_cg->write_op(OPC_VARARGC);

        /* generate the call instruction and argument count */
        G_cg->write_op(OPC_CALL);
        G_cs->write((char)argc);

        /* check the mode */
        if (G_cg->is_eval_for_dyn())
        {
            /* 
             *   dynamic (run-time) compilation - we know the absolute
             *   address already, since all symbols are pre-resolved in the
             *   debugger 
             */
            G_cs->write4(get_code_pool_addr());
        }
        else
        {
            /* 
             *   Normal compilation - we won't know the function's address
             *   until after generation is completed, so add a fixup for the
             *   current location, then write a placeholder for the offset
             *   field.  
             */
            add_abs_fixup(G_cs);
            G_cs->write4(0);
        }

        /* call removes arguments */
        G_cg->note_pop(argc);

        /* do post-call cleanup: named arg removal, etc */
        G_cg->post_call_cleanup(named_args);

        /* make sure the argument count is correct */
        if (!argc_ok(argc))
        {
            char buf[128];
            G_tok->log_error(TCERR_WRONG_ARGC_FOR_FUNC,
                             (int)get_sym_len(), get_sym(),
                             get_argc_desc(buf), argc);
        }

        /* if we're not discarding, push the return value from R0 */
        if (!discard)
        {
            G_cg->write_op(OPC_GETR0);
            G_cg->note_push();
        }
    }
}